

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
          (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this,size_t count,
          float *value,polymorphic_allocator<float> *alloc)

{
  float *pfVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  byte bVar18;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar19;
  ulong uVar20;
  ushort uVar21;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (float *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    auVar22 = vbroadcastss_avx512f(ZEXT416((uint)*value));
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpbroadcastq_avx512f();
    paVar19 = &this->field_2;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)this->ptr !=
        (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
         *)0x0) {
      paVar19 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                 *)this->ptr;
    }
    uVar20 = 0;
    do {
      auVar26 = vpbroadcastq_avx512f();
      auVar27 = vporq_avx512f(auVar26,auVar23);
      auVar26 = vporq_avx512f(auVar26,auVar24);
      uVar16 = vpcmpuq_avx512f(auVar26,auVar25,2);
      uVar17 = vpcmpuq_avx512f(auVar27,auVar25,2);
      bVar18 = (byte)uVar17;
      uVar21 = CONCAT11(bVar18,(byte)uVar16);
      pfVar1 = paVar19->fixed + uVar20;
      bVar2 = (bool)((byte)uVar16 & 1);
      bVar3 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar4 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar5 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar6 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar7 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar8 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar9 = (bool)((byte)(uVar21 >> 7) & 1);
      bVar10 = (bool)(bVar18 >> 1 & 1);
      bVar11 = (bool)(bVar18 >> 2 & 1);
      bVar12 = (bool)(bVar18 >> 3 & 1);
      bVar13 = (bool)(bVar18 >> 4 & 1);
      bVar14 = (bool)(bVar18 >> 5 & 1);
      bVar15 = (bool)(bVar18 >> 6 & 1);
      *pfVar1 = (float)((uint)bVar2 * auVar22._0_4_ | (uint)!bVar2 * (int)*pfVar1);
      pfVar1[1] = (float)((uint)bVar3 * auVar22._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
      pfVar1[2] = (float)((uint)bVar4 * auVar22._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
      pfVar1[3] = (float)((uint)bVar5 * auVar22._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
      pfVar1[4] = (float)((uint)bVar6 * auVar22._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
      pfVar1[5] = (float)((uint)bVar7 * auVar22._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
      pfVar1[6] = (float)((uint)bVar8 * auVar22._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
      pfVar1[7] = (float)((uint)bVar9 * auVar22._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
      pfVar1[8] = (float)((uint)(bVar18 & 1) * auVar22._32_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)pfVar1[8]);
      pfVar1[9] = (float)((uint)bVar10 * auVar22._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
      pfVar1[10] = (float)((uint)bVar11 * auVar22._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
      pfVar1[0xb] = (float)((uint)bVar12 * auVar22._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
      pfVar1[0xc] = (float)((uint)bVar13 * auVar22._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
      pfVar1[0xd] = (float)((uint)bVar14 * auVar22._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
      pfVar1[0xe] = (float)((uint)bVar15 * auVar22._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
      pfVar1[0xf] = (float)((uint)(bVar18 >> 7) * auVar22._60_4_ |
                           (uint)!(bool)(bVar18 >> 7) * (int)pfVar1[0xf]);
      uVar20 = uVar20 + 0x10;
    } while ((count + 0xf & 0xfffffffffffffff0) != uVar20);
  }
  this->nStored = count;
  return;
}

Assistant:

InlinedVector(size_t count, const T &value, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(begin() + i, value);
        nStored = count;
    }